

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

lgx_symbol_t *
symbol_add(lgx_ast_t *ast,lgx_ast_node_t *node,lgx_ht_t *symbols,lgx_symbol_type_t s_type,
          lgx_str_t *name,uchar is_global)

{
  int iVar1;
  lgx_ht_node_t *plVar2;
  lgx_symbol_t *symbol;
  lgx_symbol_t *symbol_1;
  lgx_ht_node_t *ht_node;
  uchar is_global_local;
  lgx_str_t *name_local;
  lgx_symbol_type_t s_type_local;
  lgx_ht_t *symbols_local;
  lgx_ast_node_t *node_local;
  lgx_ast_t *ast_local;
  
  plVar2 = lgx_ht_get(symbols,name);
  if (plVar2 == (lgx_ht_node_t *)0x0) {
    ast_local = (lgx_ast_t *)symbol_new();
    if (ast_local == (lgx_ast_t *)0x0) {
      ast_local = (lgx_ast_t *)0x0;
    }
    else {
      *(lgx_symbol_type_t *)&(ast_local->lex).source.path = s_type;
      ast_local->root = node;
      ast_local->field_0x3c = ast_local->field_0x3c & 0xfe | is_global & 1;
      iVar1 = lgx_ht_set(symbols,name,ast_local);
      if (iVar1 != 0) {
        symbol_del((lgx_symbol_t *)ast_local);
        symbol_error(ast,node,"symbol `%.*s` unkonwn error\n",(ulong)name->length,name->buffer);
        ast_local = (lgx_ast_t *)0x0;
      }
    }
  }
  else {
    symbol_error(ast,node,"symbol `%.*s` alreay declared at line %d row %d\n",(ulong)name->length,
                 name->buffer,(ulong)*(uint *)(*(long *)((long)plVar2->v + 0x40) + 0x28),
                 *(undefined4 *)(*(long *)((long)plVar2->v + 0x40) + 0x2c));
    ast_local = (lgx_ast_t *)0x0;
  }
  return (lgx_symbol_t *)ast_local;
}

Assistant:

static lgx_symbol_t* symbol_add(lgx_ast_t* ast, lgx_ast_node_t* node,
    lgx_ht_t* symbols, lgx_symbol_type_t s_type,
    lgx_str_t* name, unsigned char is_global) {

    lgx_ht_node_t* ht_node = lgx_ht_get(symbols, name);
    if (ht_node) {
        lgx_symbol_t* symbol = (lgx_symbol_t*)ht_node->v;
        symbol_error(ast, node, "symbol `%.*s` alreay declared at line %d row %d\n", name->length, name->buffer, symbol->node->line, symbol->node->row);
        return NULL;
    }

    lgx_symbol_t* symbol = symbol_new();
    if (!symbol) {
        return NULL;
    }
    symbol->s_type = s_type;
    symbol->node = node;
    symbol->is_global = is_global;

    if (lgx_ht_set(symbols, name, symbol)) {
        symbol_del(symbol);
        symbol_error(ast, node, "symbol `%.*s` unkonwn error\n", name->length, name->buffer);
        return NULL;
    }

    return symbol;
}